

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O2

void __thiscall pmx::PmxSoftBody::Read(PmxSoftBody *this,istream *param_1,PmxSetting *param_2)

{
  ostream *poVar1;
  DeadlyImportError *this_00;
  allocator<char> local_39;
  string local_38;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Not Implemented Exception");
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"MMD: Not Implemented Exception",&local_39);
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PmxSoftBody::Read(std::istream * /*stream*/, PmxSetting * /*setting*/)
	{
		std::cerr << "Not Implemented Exception" << std::endl;
        throw DeadlyImportError("MMD: Not Implemented Exception");
    }